

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall TPZSkylMatrix<double>::Decompose_LDLt(TPZSkylMatrix<double> *this)

{
  char cVar1;
  double **ppdVar2;
  int iVar3;
  int extraout_var;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  long local_90;
  long local_80;
  TPZVec<double> diag;
  long size;
  
  cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_LDLt() [TVar = double]",
               "Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  iVar3 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  size = CONCAT44(extraout_var,iVar3);
  TPZVec<double>::TPZVec(&diag,size);
  ppdVar2 = (this->fElem).fStore;
  lVar8 = 0;
  lVar9 = 0;
  if (size != 0 && -1 < extraout_var) {
    lVar9 = size;
  }
  for (; lVar9 != lVar8; lVar8 = lVar8 + 1) {
    diag.fStore[lVar8] = *ppdVar2[lVar8];
  }
  lVar8 = 2;
  lVar18 = 3;
  lVar16 = 0x10;
  local_90 = 8;
  for (lVar9 = 1; lVar9 < size; lVar9 = lVar9 + 1) {
    ppdVar2 = (this->fElem).fStore;
    lVar6 = (long)ppdVar2[lVar9 + 1] - (long)ppdVar2[lVar9];
    local_80 = lVar16 - lVar6;
    lVar6 = lVar6 >> 3;
    lVar11 = (lVar9 - lVar6) + 1;
    lVar10 = lVar8 - lVar6;
    lVar6 = lVar18 - lVar6;
    lVar12 = lVar11;
    while (lVar12 <= lVar9) {
      ppdVar2 = (this->fElem).fStore;
      lVar13 = (long)ppdVar2[lVar12 + 1] - (long)ppdVar2[lVar12] >> 3;
      lVar7 = (lVar12 + 1) - lVar13;
      if (lVar7 < lVar11) {
        lVar7 = lVar11;
      }
      lVar4 = (long)ppdVar2[lVar12] + local_80;
      lVar13 = lVar6 - lVar13;
      lVar14 = lVar13;
      if (lVar13 < lVar10) {
        lVar14 = lVar10;
      }
      lVar17 = (long)ppdVar2[lVar9] + local_90;
      dVar19 = 0.0;
      for (; lVar7 < lVar12; lVar7 = lVar7 + 1) {
        dVar19 = dVar19 + *(double *)(lVar17 + lVar14 * -8) * *(double *)(lVar4 + lVar14 * -8) *
                          diag.fStore[lVar7];
        lVar4 = lVar4 + -8;
        lVar17 = lVar17 + -8;
      }
      if (lVar13 < lVar10) {
        lVar13 = lVar10;
      }
      pdVar15 = (double *)(lVar17 + lVar13 * -8);
      lVar13 = lVar13 * -8;
      dVar19 = *pdVar15 - dVar19;
      *pdVar15 = dVar19;
      if (lVar17 == lVar4) {
        diag.fStore[lVar7] = dVar19;
        if (ABS(dVar19) < 1e-12) {
          std::operator<<((ostream *)&std::cout,"TPZSkylMatrix pivot = ");
          poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar17 + lVar13));
          std::endl<char,std::char_traits<char>>(poVar5);
          std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n");
          poVar5 = std::operator<<((ostream *)&std::cout,"j = ");
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          poVar5 = std::operator<<(poVar5," l = ");
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      else {
        *(double *)(lVar17 + lVar13) = dVar19 / *(double *)(lVar4 + lVar13);
      }
      lVar6 = lVar6 + 1;
      local_80 = local_80 + 8;
      lVar12 = lVar12 + 1;
    }
    lVar8 = lVar8 + 1;
    lVar18 = lVar18 + 1;
    lVar16 = lVar16 + 8;
    local_90 = local_90 + 8;
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  TPZVec<double>::~TPZVec(&diag);
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}